

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  double *pdVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  double in_RAX;
  ulong uVar8;
  double dVar9;
  pair<unsigned_long,_bool> pVar10;
  double local_28;
  
  local_28 = in_RAX;
LAB_003be0d7:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003be0fa;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003be0fa:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar8 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar6 | uVar8;
    }
    uVar6 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) {
LAB_003be177:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
      if (!bVar5) {
        return false;
      }
      goto LAB_003be0d7;
    }
    uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
    if (uVar7 == 2) {
      if ((char)uVar8 != '\x11') goto LAB_003be177;
      pdVar4 = (double *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pdVar4 < 8) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_28);
        dVar9 = local_28;
        if (!bVar5) {
          return false;
        }
      }
      else {
        dVar9 = *pdVar4;
        input->buffer_ = (uint8 *)(pdVar4 + 1);
      }
      this->evaluationvalue_ = dVar9;
    }
    else {
      if ((uVar7 != 1) || ((char)uVar8 != '\b')) goto LAB_003be177;
      puVar3 = input->buffer_;
      if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
        this->evaluationindex_ = (long)(char)*puVar3;
        input->buffer_ = puVar3 + 1;
      }
      else {
        pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        this->evaluationindex_ = pVar10.first;
        if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters_TreeNode_EvaluationInfo::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 evaluationIndex = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &evaluationindex_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double evaluationValue = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(17u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &evaluationvalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  return false;
#undef DO_
}